

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

char * __thiscall CaDiCaL::Parser::parse_lit(Parser *this,int *ch,int *lit,int *vars,int strict)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  Format *this_00;
  
  iVar2 = *ch;
  if (iVar2 == 0x61) {
    return "unexpected \'a\' in CNF";
  }
  if (iVar2 == 0x2d) {
    iVar2 = parse_char(this);
    *ch = iVar2;
    uVar3 = iVar2 - 0x30;
    if (9 < uVar3) {
      Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
      this_00 = &this->internal->error_message;
      pcVar5 = "expected digit after \'-\'";
      goto LAB_00678824;
    }
    iVar2 = -1;
  }
  else {
    uVar3 = iVar2 - 0x30;
    if (9 < uVar3) {
      Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
      this_00 = &this->internal->error_message;
      pcVar5 = "expected digit or \'-\'";
      goto LAB_00678824;
    }
    iVar2 = 1;
  }
  do {
    *lit = uVar3;
    iVar4 = parse_char(this);
    *ch = iVar4;
    if (9 < iVar4 - 0x30U) {
      if (iVar4 == 0xd) {
        iVar4 = parse_char(this);
        *ch = iVar4;
      }
      if (((0x21 < iVar4 + 1U) || ((0x200000c01U >> ((ulong)(iVar4 + 1U) & 0x3f) & 1) == 0)) &&
         (iVar4 != 99)) {
        Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
        pcVar5 = Format::append(&this->internal->error_message,"expected white space after \'%d\'",
                                (ulong)(uint)(iVar2 * *lit));
        return pcVar5;
      }
      iVar4 = *lit;
      if (*vars < iVar4) {
        if (strict != 0) {
          Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
          pcVar5 = Format::append(&this->internal->error_message,
                                  "literal %d exceeds maximum variable %d",
                                  (ulong)(uint)(iVar2 * *lit),(ulong)(uint)*vars);
          return pcVar5;
        }
        *vars = iVar4;
        iVar4 = *lit;
      }
      *lit = iVar4 * iVar2;
      return (char *)0x0;
    }
    iVar1 = *lit;
  } while ((iVar1 < 0xccccccd) &&
          (uVar3 = (iVar4 - 0x30U) + iVar1 * 10,
          SBORROW4(-0x7fffffd1 - iVar4,iVar1 * 10) == (-0x7fffffd1 - iVar4) + iVar1 * -10 < 0));
  Format::init(&this->internal->error_message,(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
  this_00 = &this->internal->error_message;
  pcVar5 = "literal too large";
LAB_00678824:
  pcVar5 = Format::append(this_00,pcVar5);
  return pcVar5;
}

Assistant:

inline const char *Parser::parse_lit (int &ch, int &lit, int &vars,
                                      int strict) {
  if (ch == 'a')
    return cube_token;
  int sign = 0;
  if (ch == '-') {
    if (!isdigit (ch = parse_char ()))
      PER ("expected digit after '-'");
    sign = -1;
  } else if (!isdigit (ch))
    PER ("expected digit or '-'");
  else
    sign = 1;
  lit = ch - '0';
  while (isdigit (ch = parse_char ())) {
    int digit = ch - '0';
    if (INT_MAX / 10 < lit || INT_MAX - digit < 10 * lit)
      PER ("literal too large");
    lit = 10 * lit + digit;
  }
  if (ch == '\r')
    ch = parse_char ();
  if (ch != 'c' && ch != ' ' && ch != '\t' && ch != '\n' && ch != EOF)
    PER ("expected white space after '%d'", sign * lit);
  if (lit > vars) {
    if (strict != FORCED)
      PER ("literal %d exceeds maximum variable %d", sign * lit, vars);
    else
      vars = lit;
  }
  lit *= sign;
  return 0;
}